

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void charevnt_wander_top(tgestate_t *state,route_t *route)

{
  route->index = 0xff;
  route->step = '\b';
  return;
}

Assistant:

void charevnt_wander_top(tgestate_t *state, route_t *route)
{
  // Set route to wander between random locations in the top part of the map:
  //    _________________               |
  //   |*****************|              |
  //   |*****************|______________|
  //   |*****************           :   :
  //   |       HUT   HUT   HUT      :   :
  //  _|       ONE   TWO   TRE     X:   :
  // |         HUT   HUT   HUT      :   :
  // |         ONE   TWO   TRE      :   :
  //  |                            X:   :
  // _|_______GATE_|~~~~~~~DD~~~~~~~'   :
  //              :                     :
  //              :~~~~~~~~DD~~~~~~~~~~~'
  //             X:             :
  //              :             :
  //              :            X:
  //              '~~~~~~~~~~~~~'

  route->index = routeindex_255_WANDER;
  route->step  = 8; /* 8..15 */
}